

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWFileInfo.h
# Opt level: O2

void __thiscall COLLADAFW::FileInfo::Unit::Unit(Unit *this)

{
  this->_vptr_Unit = (_func_int **)&PTR__Unit_00a05548;
  this->mLinearUnitUnit = METER;
  std::__cxx11::string::string
            ((string *)&this->mLinearUnitName,(string *)LINEAR_UNIT_METER_NAME_abi_cxx11_);
  this->mLinearUnitMeter = 1.0;
  std::__cxx11::string::string
            ((string *)&this->mAngularUnitName,(string *)ANGULAR_UNIT_DEGREES_NAME_abi_cxx11_);
  this->mAngularUnitUnit = DEGREES;
  std::__cxx11::string::string
            ((string *)&this->mTimeUnitName,(string *)TIME_UNIT_FILM_NAME_abi_cxx11_);
  this->mTimeUnitUnit = FILM;
  return;
}

Assistant:

Unit ()
                : mLinearUnitUnit ( METER )
                , mLinearUnitName ( LINEAR_UNIT_METER_NAME )
                , mLinearUnitMeter ( LINEAR_UNIT_METER )
                , mAngularUnitName ( ANGULAR_UNIT_DEGREES_NAME )
                , mAngularUnitUnit ( DEGREES )
                , mTimeUnitName ( TIME_UNIT_FILM_NAME )
                , mTimeUnitUnit ( FILM )
            {}